

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.hpp
# Opt level: O0

void __thiscall
OpenMD::GofRTheta::GofRTheta
          (GofRTheta *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          int nrbins,int nangleBins)

{
  StaticAnalyser *in_RDI;
  undefined4 in_stack_00000008;
  int in_stack_000001c4;
  RealType in_stack_000001c8;
  string *in_stack_000001d0;
  string *in_stack_000001d8;
  string *in_stack_000001e0;
  SimInfo *in_stack_000001e8;
  GofRAngle *in_stack_000001f0;
  int in_stack_00000200;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [32];
  string local_58 [88];
  
  GofRAngle::GofRAngle
            (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
             in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,in_stack_00000200);
  in_RDI->_vptr_StaticAnalyser = (_func_int **)&PTR__GofRTheta_0055ebb0;
  getPrefix(in_stack_ffffffffffffff78);
  std::operator+(in_stack_ffffffffffffff78,(char *)in_RDI);
  StaticAnalyser::setOutputName
            (in_RDI,(string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_00000008));
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

GofRTheta(SimInfo* info, const std::string& filename,
              const std::string& sele1, const std::string& sele2, RealType len,
              int nrbins, int nangleBins) :
        GofRAngle(info, filename, sele1, sele2, len, nrbins, nangleBins) {
      setOutputName(getPrefix(filename) + ".gofrt");
    }